

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O2

void __thiscall ON_PointGrid::ON_PointGrid(ON_PointGrid *this)

{
  ON_Geometry::ON_Geometry(&this->super_ON_Geometry);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_008299d0;
  ON_3dPointArray::ON_3dPointArray(&this->m_point);
  this->m_point_count[0] = 0;
  this->m_point_count[1] = 0;
  this->m_point_stride0 = 0;
  if (-1 < (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_capacity) {
    (this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_count = 0;
  }
  return;
}

Assistant:

ON_PointGrid::ON_PointGrid()
{
  Initialize();
}